

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushMultiItemsWidths(int components,float w_full)

{
  ImGuiNextItemData *pIVar1;
  ImGuiWindow *pIVar2;
  float *pfVar3;
  ImGuiContext *pIVar4;
  float *pfVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  iVar8 = (pIVar2->DC).ItemWidthStack.Size;
  if (iVar8 == (pIVar2->DC).ItemWidthStack.Capacity) {
    if (iVar8 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar8 / 2 + iVar8;
    }
    iVar7 = iVar8 + 1;
    if (iVar8 + 1 < iVar6) {
      iVar7 = iVar6;
    }
    pfVar5 = (float *)MemAlloc((long)iVar7 << 2);
    pfVar3 = (pIVar2->DC).ItemWidthStack.Data;
    if (pfVar3 != (float *)0x0) {
      memcpy(pfVar5,pfVar3,(long)(pIVar2->DC).ItemWidthStack.Size << 2);
      MemFree((pIVar2->DC).ItemWidthStack.Data);
    }
    (pIVar2->DC).ItemWidthStack.Data = pfVar5;
    (pIVar2->DC).ItemWidthStack.Capacity = iVar7;
    iVar8 = (pIVar2->DC).ItemWidthStack.Size;
  }
  else {
    pfVar5 = (pIVar2->DC).ItemWidthStack.Data;
  }
  pfVar5[iVar8] = (pIVar2->DC).ItemWidth;
  iVar8 = (pIVar2->DC).ItemWidthStack.Size + 1;
  (pIVar2->DC).ItemWidthStack.Size = iVar8;
  fVar9 = w_full - (float)(components + -1) * (pIVar4->Style).ItemInnerSpacing.x;
  fVar10 = fVar9;
  if (1 < components) {
    fVar11 = (float)components;
    fVar12 = fVar9;
    do {
      components = components + -1;
      fVar10 = (float)(int)(((float)components * fVar9) / fVar11);
      fVar12 = fVar12 - fVar10;
      if (fVar12 <= 1.0) {
        fVar12 = 1.0;
      }
      if (iVar8 == (pIVar2->DC).ItemWidthStack.Capacity) {
        if (iVar8 == 0) {
          iVar6 = 8;
        }
        else {
          iVar6 = iVar8 / 2 + iVar8;
        }
        iVar7 = iVar8 + 1;
        if (iVar8 + 1 < iVar6) {
          iVar7 = iVar6;
        }
        pfVar5 = (float *)MemAlloc((long)iVar7 << 2);
        pfVar3 = (pIVar2->DC).ItemWidthStack.Data;
        if (pfVar3 != (float *)0x0) {
          memcpy(pfVar5,pfVar3,(long)(pIVar2->DC).ItemWidthStack.Size << 2);
          MemFree((pIVar2->DC).ItemWidthStack.Data);
        }
        (pIVar2->DC).ItemWidthStack.Data = pfVar5;
        (pIVar2->DC).ItemWidthStack.Capacity = iVar7;
        iVar8 = (pIVar2->DC).ItemWidthStack.Size;
      }
      else {
        pfVar5 = (pIVar2->DC).ItemWidthStack.Data;
      }
      pfVar5[iVar8] = fVar12;
      iVar8 = (pIVar2->DC).ItemWidthStack.Size + 1;
      (pIVar2->DC).ItemWidthStack.Size = iVar8;
      fVar12 = fVar10;
    } while (1 < components);
  }
  if (fVar10 <= 1.0) {
    fVar10 = 1.0;
  }
  (pIVar2->DC).ItemWidth = fVar10;
  pIVar1 = &pIVar4->NextItemData;
  *(byte *)&pIVar1->Flags = (byte)pIVar1->Flags & 0xfe;
  return;
}

Assistant:

void ImGui::PushMultiItemsWidths(int components, float w_full)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(components > 0);
    const ImGuiStyle& style = g.Style;
    window->DC.ItemWidthStack.push_back(window->DC.ItemWidth); // Backup current width
    float w_items = w_full - style.ItemInnerSpacing.x * (components - 1);
    float prev_split = w_items;
    for (int i = components - 1; i > 0; i--)
    {
        float next_split = IM_TRUNC(w_items * i / components);
        window->DC.ItemWidthStack.push_back(ImMax(prev_split - next_split, 1.0f));
        prev_split = next_split;
    }
    window->DC.ItemWidth = ImMax(prev_split, 1.0f);
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}